

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scan.cpp
# Opt level: O0

void test_initialized_transform_inclusive_scan<int,std::plus<int>>(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  int iVar2;
  reference pvVar3;
  undefined1 *__stat_loc;
  double __x;
  double __x_00;
  Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&> EVar4;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task task2;
  Task alloc;
  Task task1;
  int init;
  size_t i;
  iterator dbeg;
  iterator send;
  iterator sbeg;
  vector<int,_std::allocator<int>_> golden;
  vector<int,_std::allocator<int>_> output;
  vector<int,_std::allocator<int>_> input;
  size_t n;
  size_t limit;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffa78;
  Result *res;
  undefined4 in_stack_fffffffffffffa80;
  Enum in_stack_fffffffffffffa84;
  Executor *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  Enum in_stack_fffffffffffffa94;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa98;
  Enum at;
  Taskflow *in_stack_fffffffffffffaa0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffab0;
  undefined8 c;
  FlowBuilder *this;
  Executor *in_stack_fffffffffffffb00;
  Enum in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  ExpressionDecomposer local_4ec;
  Executor *local_4e8;
  Enum local_4e0;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffb68;
  size_t in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  ExpressionDecomposer local_42c;
  vector<int,_std::allocator<int>_> *local_428;
  Enum local_420;
  ResultBuilder local_3f8;
  __basic_future<void> local_380 [2];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_358;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_350;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_348;
  FlowBuilder local_340;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_338;
  Taskflow *local_330;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_328;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_320;
  int *local_308;
  int *local_300;
  int *local_2f8;
  FlowBuilder local_2f0;
  int *local_2e8;
  int *local_2d8;
  int *local_2d0;
  int *local_2c8;
  int local_2bc;
  anon_class_32_4_6a670194 *local_2b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2a0;
  FlowBuilder local_291 [8];
  Taskflow local_250;
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),in_stack_fffffffffffffa78
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
             in_stack_fffffffffffffb68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x194c5c);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffaa0);
  local_250._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x3d090;
  local_250._mutex.super___mutex_base._M_mutex._16_8_ = (anon_class_32_4_6a670194 *)0x0;
  while( true ) {
    if (local_250._mutex.super___mutex_base._M_mutex.__data.__list.__prev <
        (ulong)local_250._mutex.super___mutex_base._M_mutex._16_8_) {
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      tf::Executor::~Executor((Executor *)in_stack_fffffffffffffab0._M_current);
      return;
    }
    tf::Taskflow::clear((Taskflow *)0x194ca6);
    std::allocator<int>::allocator((allocator<int> *)0x194cc5);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa0,
               (size_type)in_stack_fffffffffffffa98,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    std::allocator<int>::~allocator((allocator<int> *)0x194ceb);
    std::allocator<int>::allocator((allocator<int> *)0x194d0a);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa0,
               (size_type)in_stack_fffffffffffffa98,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    std::allocator<int>::~allocator((allocator<int> *)0x194d30);
    this = local_291;
    c = local_250._mutex.super___mutex_base._M_mutex._16_8_;
    std::allocator<int>::allocator((allocator<int> *)0x194d4f);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffaa0,
               (size_type)in_stack_fffffffffffffa98,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    std::allocator<int>::~allocator((allocator<int> *)0x194d75);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              (&local_2a0);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              (&local_2a8);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              (&local_2b0);
    for (local_2b8 = (anon_class_32_4_6a670194 *)0x0;
        at = (Enum)((ulong)in_stack_fffffffffffffa98 >> 0x20),
        local_2b8 < (ulong)local_250._mutex.super___mutex_base._M_mutex._16_8_;
        local_2b8 = (anon_class_32_4_6a670194 *)((long)&local_2b8->sbeg + 1)) {
      iVar2 = rand();
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&local_250,(size_type)local_2b8);
      *pvVar3 = iVar2 % 10;
    }
    local_2bc = rand();
    local_2bc = local_2bc % 10;
    local_2c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    local_2d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    in_stack_fffffffffffffab0 =
         std::
         transform_inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>,test_initialized_transform_inclusive_scan<int,std::plus<int>>(unsigned_int)::_lambda(auto:1)_1_,int>
                   (local_2c8,local_2d0,local_2d8,local_2bc);
    in_stack_fffffffffffffaa0 = &local_250;
    local_2e8 = in_stack_fffffffffffffab0._M_current;
    local_2f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    local_300 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    local_308 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    tf::FlowBuilder::
    transform_inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>,test_initialized_transform_inclusive_scan<int,std::plus<int>>(unsigned_int)::_lambda(auto:1)_2_,int>
              (&local_2f0,(undefined1 *)((long)&local_250._mutex.super___mutex_base._M_mutex + 0x20)
               ,local_2f8,local_300,local_308,local_2bc);
    local_338 = &local_2a0;
    local_330 = &local_250;
    local_328 = &local_2a8;
    local_320 = &local_2b0;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_scan_cpp:548:35),_nullptr>
              (this,(anon_class_32_4_6a670194 *)c);
    local_348 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffa78);
    local_350 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffa78);
    local_358 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffffa78);
    tf::FlowBuilder::
    transform_inclusive_scan<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::plus<int>,test_initialized_transform_inclusive_scan<int,std::plus<int>>(unsigned_int)::_lambda(auto:1)_3_,int>
              (&local_340,(undefined1 *)((long)&local_250._mutex.super___mutex_base._M_mutex + 0x20)
               ,local_348,local_350,local_358,local_2bc);
    tf::Task::precede<tf::Task&>
              ((Task *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               (Task *)in_stack_fffffffffffffa78);
    tf::Task::precede<tf::Task&>
              ((Task *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               (Task *)in_stack_fffffffffffffa78);
    __stat_loc = local_140;
    tf::Executor::run(in_stack_fffffffffffffa88,
                      (Taskflow *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    iVar2 = (int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
    std::__basic_future<void>::wait(local_380,__stat_loc);
    tf::Future<void>::~Future
              ((Future<void> *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    res = (Result *)0x1b5e0d;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffffaa0,at,
               (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),iVar2,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),"",
               (char *)in_stack_fffffffffffffab0._M_current);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_42c,DT_REQUIRE);
    EVar4 = doctest::detail::ExpressionDecomposer::
            operator<<<std::vector<int,_std::allocator<int>_>,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       (vector<int,_std::allocator<int>_> *)res);
    in_stack_fffffffffffffa98 = EVar4.lhs;
    in_stack_fffffffffffffa94 = EVar4.m_at;
    local_428 = in_stack_fffffffffffffa98;
    local_420 = in_stack_fffffffffffffa94;
    doctest::detail::Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&>::
    operator==<std::vector<int,_std::allocator<int>_>,_nullptr>
              ((Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),res);
    doctest::detail::Result::~Result((Result *)0x1951ed);
    doctest::detail::ResultBuilder::log(&local_3f8,__x);
    in_stack_fffffffffffffa90 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffa90);
    if ((extraout_AL & 1) != 0) break;
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x195302);
    in_stack_fffffffffffffa78 = (Result *)0x1b5e0d;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffffaa0,
               (Enum)((ulong)in_stack_fffffffffffffa98 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),iVar2,
               (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),"",
               (char *)in_stack_fffffffffffffab0._M_current);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4ec,DT_REQUIRE);
    EVar4 = doctest::detail::ExpressionDecomposer::
            operator<<<std::vector<int,_std::allocator<int>_>,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa78);
    in_stack_fffffffffffffa88 = (Executor *)EVar4.lhs;
    in_stack_fffffffffffffa84 = EVar4.m_at;
    in_stack_fffffffffffffb00 = in_stack_fffffffffffffa88;
    in_stack_fffffffffffffb08 = in_stack_fffffffffffffa84;
    local_4e8 = in_stack_fffffffffffffa88;
    local_4e0 = in_stack_fffffffffffffa84;
    doctest::detail::Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&>::
    operator==<std::vector<int,_std::allocator<int>_>,_nullptr>
              ((Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffa84),
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa88);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa78);
    doctest::detail::Result::~Result((Result *)0x1953e7);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffb48,__x_00);
    in_stack_fffffffffffffa80 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffffa80);
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1954c6);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    local_250._mutex.super___mutex_base._M_mutex._16_8_ =
         local_250._mutex.super___mutex_base._M_mutex._16_8_ * 2 + 1;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void test_initialized_transform_inclusive_scan(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow;

  size_t limit = std::is_same_v<T, std::string> ? 2500 : 250000;
  
  for(size_t n=0; n<=limit; n=n*2+1) {

    taskflow.clear();
    
    std::vector<T> input(n), output(n), golden(n); 
    typename std::vector<T>::iterator sbeg, send, dbeg;

    for(size_t i=0; i<n; i++) {
      input[i] = ::rand() % 10;
    }

    T init = ::rand() % 10;

    std::transform_inclusive_scan(
      input.begin(), input.end(), golden.begin(), B(),
      [](auto item){ return item*2; },
      init
    );
    
    // out-of-place
    auto task1 = taskflow.transform_inclusive_scan(
      input.begin(), input.end(), output.begin(), B(),
      [](auto item){ return item*2; },
      init
    );  
    
    // enable stateful capture
    auto alloc = taskflow.emplace([&](){
      sbeg = input.begin();
      send = input.end();
      dbeg = input.begin();
    });
    
    // in-place
    auto task2 = taskflow.transform_inclusive_scan(
      std::ref(sbeg), std::ref(send), std::ref(dbeg), B(),
      [](auto item){ return item*2; },
      init
    );

    task1.precede(alloc);
    alloc.precede(task2);

    executor.run(taskflow).wait();

    REQUIRE(input == golden);
    REQUIRE(output == golden);
  }
}